

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::values::parse_value<int>(string *text,int *value)

{
  long *plVar1;
  long lVar2;
  argument_incorrect_type *this;
  istringstream is;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)text,_S_in);
  plVar1 = (long *)std::istream::operator>>(&is,value);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    lVar2 = std::streambuf::in_avail();
    if (lVar2 == 0) {
      std::__cxx11::istringstream::~istringstream((istringstream *)&is);
      return;
    }
    this = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this,text);
  }
  else {
    this = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this,text);
  }
  __cxa_throw(this,&argument_incorrect_type::typeinfo,OptionException::~OptionException);
}

Assistant:

void
    parse_value(const std::string& text, T& value)
    {
      std::istringstream is(text);
      if (!(is >> value))
      {
        throw argument_incorrect_type(text);
      }

      if (is.rdbuf()->in_avail() != 0)
      {
        throw argument_incorrect_type(text);
      }
    }